

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# option-parser.cc
# Opt level: O0

void __thiscall
wabt::OptionParser::AddOption
          (OptionParser *this,char short_name,char *long_name,char *metavar,char *help,
          Callback *callback)

{
  allocator local_149;
  string local_148;
  allocator local_121;
  string local_120;
  allocator local_e9;
  string local_e8;
  undefined1 local_c8 [8];
  Option option;
  Callback *callback_local;
  char *help_local;
  char *metavar_local;
  char *long_name_local;
  char short_name_local;
  OptionParser *this_local;
  
  option.callback._M_invoker = (_Invoker_type)callback;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_e8,long_name,&local_e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_120,metavar,&local_121);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_148,help,&local_149);
  Option::Option((Option *)local_c8,short_name,&local_e8,&local_120,Yes,&local_148,
                 (Callback *)option.callback._M_invoker);
  std::__cxx11::string::~string((string *)&local_148);
  std::allocator<char>::~allocator((allocator<char> *)&local_149);
  std::__cxx11::string::~string((string *)&local_120);
  std::allocator<char>::~allocator((allocator<char> *)&local_121);
  std::__cxx11::string::~string((string *)&local_e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_e9);
  AddOption(this,(Option *)local_c8);
  Option::~Option((Option *)local_c8);
  return;
}

Assistant:

void OptionParser::AddOption(char short_name,
                             const char* long_name,
                             const char* metavar,
                             const char* help,
                             const Callback& callback) {
  Option option(short_name, long_name, metavar, HasArgument::Yes, help,
                callback);
  AddOption(option);
}